

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpLexer.cpp
# Opt level: O2

void __thiscall GrpLexer::mOP_PLUSEQUAL(GrpLexer *this,bool _createToken)

{
  Token *pTVar1;
  Token *pTVar2;
  allocator local_59;
  RefToken _token;
  RefCount<Token> local_50 [4];
  
  _token.ref = (Ref *)0x0;
  std::__cxx11::string::string((string *)local_50,"+=",&local_59);
  (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0x17])(this,local_50);
  std::__cxx11::string::~string((string *)local_50);
  if (_createToken) {
    if (_token.ref == (Ref *)0x0) {
      pTVar1 = (Token *)0x0;
    }
    else {
      pTVar1 = (_token.ref)->ptr;
    }
    if (nullToken.ref == (Ref *)0x0) {
      pTVar2 = (Token *)0x0;
    }
    else {
      pTVar2 = (nullToken.ref)->ptr;
    }
    if (pTVar1 == pTVar2) {
      (*(this->super_CharScanner).super_TokenStream._vptr_TokenStream[0x13])(local_50,this,5);
      RefCount<Token>::operator=(&_token,local_50);
      RefCount<Token>::~RefCount(local_50);
      if (_token.ref == (Ref *)0x0) {
        pTVar1 = (Token *)0x0;
      }
      else {
        pTVar1 = (_token.ref)->ptr;
      }
      std::__cxx11::string::substr((ulong)local_50,(ulong)&(this->super_CharScanner).text);
      (*pTVar1->_vptr_Token[6])(pTVar1,local_50);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  RefCount<Token>::operator=(&(this->super_CharScanner)._returnToken,&_token);
  RefCount<Token>::~RefCount(&_token);
  return;
}

Assistant:

void GrpLexer::mOP_PLUSEQUAL(bool _createToken) {
	int _ttype; RefToken _token; auto _begin=text.length();
	_ttype = OP_PLUSEQUAL;
	
	match("+=");
	if ( _createToken && _token==nullToken && _ttype!=Token::SKIP ) {
	   _token = makeToken(_ttype);
	   _token->setText(text.substr(_begin, text.length()-_begin));
	}
	_returnToken = _token;
}